

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * __thiscall
IDLExport::getIDLRelative
          (string *__return_storage_ptr__,IDLExport *this,Type *type,string *relative_to)

{
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  anon_unknown.dwarf_1aacf::getIDLBase
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58,type,this,&local_98);
  if (local_58._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_58 + 0x20));
  }
  else {
    Typelib::Type::getBasename_abi_cxx11_();
    std::operator+(&bStack_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_78);
    Typelib::getMinimalPathTo((string *)&local_b8,(string *)&bStack_d8);
    std::__cxx11::string::~string((string *)&bStack_d8);
    std::__cxx11::string::~string((string *)&local_78);
    boost::algorithm::replace_all<std::__cxx11::string,char_const*,char[3]>
              (&local_b8,&Typelib::NamespaceMarkString,(char (*) [3])"::");
    anon_unknown.dwarf_1aacf::normalizeIDLName(&bStack_d8,&local_b8);
    std::operator+(__return_storage_ptr__,&bStack_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_58 + 0x20));
    std::__cxx11::string::~string((string *)&bStack_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_58);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLRelative(Type const& type, std::string const& relative_to) const
{
    return ::getIDLRelative(type, relative_to, *this);
}